

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall
tinyxml2::XMLAttribute::ParseDeep
          (XMLAttribute *this,char *p,bool processEntities,int *curLineNumPtr)

{
  char *pcVar1;
  char endTag [2];
  char local_1a [2];
  
  pcVar1 = StrPair::ParseName(&this->_name,p);
  if (((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) &&
     (pcVar1 = XMLUtil::SkipWhiteSpace(pcVar1,curLineNumPtr), *pcVar1 == '=')) {
    pcVar1 = XMLUtil::SkipWhiteSpace(pcVar1 + 1,curLineNumPtr);
    local_1a[0] = *pcVar1;
    if ((local_1a[0] == '\'') || (local_1a[0] == '\"')) {
      local_1a[1] = 0;
      pcVar1 = StrPair::ParseText(&this->_value,pcVar1 + 1,local_1a,processEntities | 2,
                                  curLineNumPtr);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char* XMLAttribute::ParseDeep(char* p, bool processEntities, int* curLineNumPtr)
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName(p);
    if (!p || !*p) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace(p, curLineNumPtr);
    if (*p != '=') {
        return 0;
    }

    ++p; // move up to opening quote
    p = XMLUtil::SkipWhiteSpace(p, curLineNumPtr);
    if (*p != '\"' && *p != '\'') {
        return 0;
    }

    const char endTag[2] = {*p, 0};
    ++p; // move past opening quote

    p = _value.ParseText(
        p,
        endTag,
        processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES,
        curLineNumPtr);
    return p;
}